

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_syst_inv.c
# Opt level: O2

_Bool test_syst_inv(int K_lower,int K_upper)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  void *__ptr;
  void *__ptr_00;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  undefined8 uStack_60;
  size_t interProgSize;
  size_t interWorkSize;
  size_t interSymNum;
  
  puts("Checking for invertibility from the K source symbols.");
  lVar4 = 0;
  uVar6 = 0;
  do {
    if ((lVar4 == 0x774) || (uVar1 = *(uint *)((long)Kprime + lVar4), K_upper < (int)uVar1)) {
      printf("--> Passed, %d values were tested.\n",(ulong)uVar6);
      return true;
    }
    if (K_lower <= (int)uVar1) {
      printf("--> Checking K=%d\n",(ulong)uVar1);
      uVar3 = RqInterGetMemSizes(uVar1,0,&interWorkSize,&interProgSize,&interSymNum);
      sVar2 = interWorkSize;
      if ((int)uVar3 < 0) {
        pcVar5 = "RqInterGetMemSizes(K, 0, &interWorkSize, &interProgSize, &interSymNum)";
        uStack_60 = 0x57;
LAB_001013ad:
        fprintf(_stderr,"Error:%s:%d: %s failed: %d.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/rq_syst_inv.c"
                ,uStack_60,pcVar5,(ulong)uVar3);
        return false;
      }
      __ptr = malloc(interWorkSize);
      uVar3 = RqInterInit(uVar1,0,__ptr,sVar2);
      if ((int)uVar3 < 0) {
        pcVar5 = "RqInterInit(K, 0, interWork, interWorkSize)";
        uStack_60 = 0x59;
        goto LAB_001013ad;
      }
      uVar3 = RqInterAddIds(__ptr,0,uVar1);
      sVar2 = interProgSize;
      if ((int)uVar3 < 0) {
        pcVar5 = "RqInterAddIds(interWork, 0, K)";
        uStack_60 = 0x5a;
        goto LAB_001013ad;
      }
      __ptr_00 = malloc(interProgSize);
      uVar3 = RqInterCompile(__ptr,__ptr_00,sVar2);
      if ((int)uVar3 < 0) {
        pcVar5 = "RqInterCompile(interWork, interProg, interProgSize)";
        uStack_60 = 0x5c;
        goto LAB_001013ad;
      }
      free(__ptr_00);
      free(__ptr);
      uVar6 = uVar6 + 1;
    }
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

bool test_syst_inv(int K_lower, int K_upper)
{
	printf("Checking for invertibility from the K source symbols.\n");
	int ntest = 0;
	int i;
	for (i = 0; i < n_Kprime && Kprime[i] <= K_upper; ++i) {
		const int K = Kprime[i];
		if (K < K_lower)
			continue;
		printf("--> Checking K=%d\n", K);
		size_t interWorkSize, interProgSize, interSymNum;
#define RUN_NOFAIL(x) \
	do { \
		int RUN_NOFAIL_err; \
		if ((RUN_NOFAIL_err = (x)) < 0) { \
			fprintf(stderr, "Error:%s:%d: %s failed: %d.\n", \
				__FILE__, __LINE__, #x, RUN_NOFAIL_err); \
			return false; \
		} \
	} while(0)

		RUN_NOFAIL(RqInterGetMemSizes(K, 0,
		  &interWorkSize, &interProgSize, &interSymNum));
		RqInterWorkMem* interWork = malloc(interWorkSize);
		RUN_NOFAIL(RqInterInit(K, 0, interWork, interWorkSize));
		RUN_NOFAIL(RqInterAddIds(interWork, 0, K));
		RqInterProgram* interProg = malloc(interProgSize);
		RUN_NOFAIL(RqInterCompile(interWork, interProg, interProgSize));
#undef RUN_NOFAIL

		free(interProg);
		free(interWork);

		++ntest;
	}
	printf("--> Passed, %d values were tested.\n", ntest);
	return true;
}